

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::UpdateMouseMovingWindowNewFrame(void)

{
  ImGuiViewportFlags *pIVar1;
  ImGuiID *pIVar2;
  ImGuiID *pIVar3;
  float fVar4;
  ImGuiID IVar5;
  ImGuiWindow_conflict *pIVar6;
  ImGuiViewportP_conflict1 *pIVar7;
  ImGuiContext_conflict1 *pIVar8;
  bool bVar9;
  ImGuiContext_conflict1 *g;
  bool bVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  ImVec2 pos;
  ImVec2 local_20;
  
  pIVar8 = GImGui;
  pIVar6 = GImGui->MovingWindow;
  if (pIVar6 == (ImGuiWindow_conflict *)0x0) {
    if (GImGui->ActiveIdWindow == (ImGuiWindow_conflict *)0x0) {
      return;
    }
    IVar5 = GImGui->ActiveId;
    if (GImGui->ActiveIdWindow->MoveId != IVar5) {
      return;
    }
    GImGui->ActiveIdIsAlive = IVar5;
    if (pIVar8->ActiveIdPreviousFrame == IVar5) {
      pIVar8->ActiveIdPreviousFrameIsAlive = true;
    }
    if ((pIVar8->IO).MouseDown[0] != false) {
      return;
    }
LAB_001878a5:
    ClearActiveID();
    return;
  }
  pIVar2 = &GImGui->ActiveId;
  pIVar3 = &GImGui->ActiveIdPreviousFrame;
  GImGui->ActiveIdIsAlive = *pIVar2;
  if (*pIVar3 == *pIVar2) {
    pIVar8->ActiveIdPreviousFrameIsAlive = true;
  }
  pIVar6 = pIVar6->RootWindowDockTree;
  if (pIVar6 == (ImGuiWindow_conflict *)0x0) {
    __assert_fail("g.MovingWindow && g.MovingWindow->RootWindowDockTree",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui.cpp"
                  ,0xe63,"void ImGui::UpdateMouseMovingWindowNewFrame()");
  }
  bVar10 = true;
  if (pIVar6->WasActive == true) {
    bVar10 = pIVar6->Viewport == (ImGuiViewportP_conflict1 *)0x0;
  }
  if (((pIVar8->IO).MouseDown[0] != true) ||
     (bVar9 = IsMousePosValid(&(pIVar8->IO).MousePos), (~bVar9 & 1U) != 0 || bVar10)) {
    if (!bVar10) {
      if ((pIVar8->ConfigFlagsCurrFrame & 0x400) != 0) {
        UpdateTryMergeWindowIntoHostViewport(pIVar6,pIVar8->MouseViewport);
      }
      if ((GImGui->DragDropActive != true) || (GImGui->DragDropAcceptIdPrev == 0)) {
        pIVar8->MouseViewport = pIVar6->Viewport;
      }
      pIVar1 = &(pIVar6->Viewport->super_ImGuiViewport).Flags;
      *pIVar1 = *pIVar1 & 0xffffff7f;
    }
    pIVar8->MovingWindow = (ImGuiWindow_conflict *)0x0;
    goto LAB_001878a5;
  }
  fVar11 = (pIVar8->IO).MousePos.x - (pIVar8->ActiveIdClickOffset).x;
  fVar12 = (pIVar8->IO).MousePos.y - (pIVar8->ActiveIdClickOffset).y;
  local_20.y = fVar12;
  local_20.x = fVar11;
  fVar4 = (pIVar6->Pos).x;
  if ((fVar4 == fVar11) && (!NAN(fVar4) && !NAN(fVar11))) {
    fVar4 = (pIVar6->Pos).y;
    if ((fVar4 == fVar12) && (!NAN(fVar4) && !NAN(fVar12))) goto LAB_00187a04;
  }
  if (((pIVar6->Flags & 0x100) == 0) && (GImGui->SettingsDirtyTimer <= 0.0)) {
    GImGui->SettingsDirtyTimer = (GImGui->IO).IniSavingRate;
  }
  SetWindowPos(pIVar6,&local_20,1);
  if (pIVar6->ViewportOwned == true) {
    (pIVar6->Viewport->super_ImGuiViewport).Pos = local_20;
    pIVar7 = pIVar6->Viewport;
    fVar4 = (pIVar7->WorkOffsetMin).x;
    fVar11 = (pIVar7->WorkOffsetMin).y;
    fVar12 = (pIVar7->super_ImGuiViewport).Pos.y;
    fVar13 = ((pIVar7->super_ImGuiViewport).Size.x - fVar4) + (pIVar7->WorkOffsetMax).x;
    fVar14 = ((pIVar7->super_ImGuiViewport).Size.y - fVar11) + (pIVar7->WorkOffsetMax).y;
    (pIVar7->super_ImGuiViewport).WorkPos.x = (pIVar7->super_ImGuiViewport).Pos.x + fVar4;
    (pIVar7->super_ImGuiViewport).WorkPos.y = fVar12 + fVar11;
    (pIVar7->super_ImGuiViewport).WorkSize.x = (float)(~-(uint)(fVar13 <= 0.0) & (uint)fVar13);
    (pIVar7->super_ImGuiViewport).WorkSize.y = (float)(~-(uint)(fVar14 <= 0.0) & (uint)fVar14);
  }
LAB_00187a04:
  FocusWindow(pIVar8->MovingWindow);
  return;
}

Assistant:

void ImGui::UpdateMouseMovingWindowNewFrame()
{
    ImGuiContext& g = *GImGui;
    if (g.MovingWindow != NULL)
    {
        // We actually want to move the root window. g.MovingWindow == window we clicked on (could be a child window).
        // We track it to preserve Focus and so that generally ActiveIdWindow == MovingWindow and ActiveId == MovingWindow->MoveId for consistency.
        KeepAliveID(g.ActiveId);
        IM_ASSERT(g.MovingWindow && g.MovingWindow->RootWindowDockTree);
        ImGuiWindow* moving_window = g.MovingWindow->RootWindowDockTree;

        // When a window stop being submitted while being dragged, it may will its viewport until next Begin()
        const bool window_disappared = (!moving_window->WasActive || moving_window->Viewport == NULL);
        if (g.IO.MouseDown[0] && IsMousePosValid(&g.IO.MousePos) && !window_disappared)
        {
            ImVec2 pos = g.IO.MousePos - g.ActiveIdClickOffset;
            if (moving_window->Pos.x != pos.x || moving_window->Pos.y != pos.y)
            {
                MarkIniSettingsDirty(moving_window);
                SetWindowPos(moving_window, pos, ImGuiCond_Always);
                if (moving_window->ViewportOwned) // Synchronize viewport immediately because some overlays may relies on clipping rectangle before we Begin() into the window.
                {
                    moving_window->Viewport->Pos = pos;
                    moving_window->Viewport->UpdateWorkRect();
                }
            }
            FocusWindow(g.MovingWindow);
        }
        else
        {
            if (!window_disappared)
            {
                // Try to merge the window back into the main viewport.
                // This works because MouseViewport should be != MovingWindow->Viewport on release (as per code in UpdateViewports)
                if (g.ConfigFlagsCurrFrame & ImGuiConfigFlags_ViewportsEnable)
                    UpdateTryMergeWindowIntoHostViewport(moving_window, g.MouseViewport);

                // Restore the mouse viewport so that we don't hover the viewport _under_ the moved window during the frame we released the mouse button.
                if (!IsDragDropPayloadBeingAccepted())
                    g.MouseViewport = moving_window->Viewport;

                // Clear the NoInput window flag set by the Viewport system
                moving_window->Viewport->Flags &= ~ImGuiViewportFlags_NoInputs; // FIXME-VIEWPORT: Test engine managed to crash here because Viewport was NULL.
            }

            g.MovingWindow = NULL;
            ClearActiveID();
        }
    }
    else
    {
        // When clicking/dragging from a window that has the _NoMove flag, we still set the ActiveId in order to prevent hovering others.
        if (g.ActiveIdWindow && g.ActiveIdWindow->MoveId == g.ActiveId)
        {
            KeepAliveID(g.ActiveId);
            if (!g.IO.MouseDown[0])
                ClearActiveID();
        }
    }
}